

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O3

bool __thiscall LPCMStreamReader::detectLPCMType(LPCMStreamReader *this,uint8_t *buffer,int64_t len)

{
  int iVar1;
  bool bVar2;
  uint16_t uVar3;
  uint8_t *puVar4;
  
  if (len == 0) {
    return false;
  }
  iVar1 = (this->super_SimplePacketizerReader).m_containerDataType;
  if (iVar1 == 0x180) {
    this->m_headerType = htWAVE;
  }
  else {
    if (*buffer == 'r') {
      if (((buffer[1] == 'i') && (buffer[2] == 'f')) && (buffer[3] == 'f')) goto LAB_00191a75;
    }
    else if (((*buffer == 'R') && (buffer[1] == 'I')) && ((buffer[2] == 'F' && (buffer[3] == 'F'))))
    {
LAB_00191a75:
      this->m_headerType = htWAVE;
      bVar2 = wave_format::GUID::operator==((GUID *)buffer,(GUID *)wave_format::WAVE64GUID);
      if (bVar2) {
        this->m_headerType = htWAVE64;
        return true;
      }
      return true;
    }
    if (((iVar1 != 0x80) && (this->m_testMode != false)) &&
       ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_containerType != ctLPCM))
    {
      return false;
    }
    if (0 < len) {
      puVar4 = buffer + len;
      do {
        uVar3 = AV_RB16(buffer);
        if (uVar3 < 0x10e0) {
          if (uVar3 < 0x780) {
            if ((uVar3 != 0x3c0) && (uVar3 != 0x5a0)) {
              return false;
            }
          }
          else if (((uVar3 != 0x780) && (uVar3 != 0xb40)) && (uVar3 != 0xf00)) {
            return false;
          }
        }
        else if (uVar3 < 0x21c0) {
          if (((uVar3 != 0x10e0) && (uVar3 != 0x1680)) && (uVar3 != 0x1e00)) {
            return false;
          }
        }
        else if (((uVar3 != 0x21c0) && (uVar3 != 0x4380)) && (uVar3 != 0x2d00)) {
          return false;
        }
        buffer = buffer + (ulong)uVar3 + 4;
      } while (buffer < puVar4);
    }
    this->m_headerType = htM2TS;
  }
  return true;
}

Assistant:

bool LPCMStreamReader::detectLPCMType(uint8_t* buffer, const int64_t len)
{
    if (len == 0)
        return false;

    if (m_containerDataType == TRACKTYPE_WAV)
    {
        m_headerType = LPCMHeaderType::htWAVE;
        return true;
    }

    const uint8_t* end = buffer + len;
    // 1. test for WAVEHeader
    uint8_t* curPos = buffer;
    if ((curPos[0] == 'R' && curPos[1] == 'I' && curPos[2] == 'F' && curPos[3] == 'F') ||
        (curPos[0] == 'r' && curPos[1] == 'i' && curPos[2] == 'f' && curPos[3] == 'f'))
    {
        m_headerType = LPCMHeaderType::htWAVE;
        const auto testWave64 = reinterpret_cast<GUID*>(curPos);
        if (*testWave64 == WAVE64GUID)
            m_headerType = LPCMHeaderType::htWAVE64;
        return true;
    }

    if (m_testMode && m_containerType != ContainerType::ctLPCM && m_containerDataType != TRACKTYPE_PCM)
        return false;  // LPCM definition has too few bytes. We can't detect LPCM without hints from source container

    // 2. test for M2TS LPCM headers
    curPos = buffer;
    while (curPos < end)
    {
        const uint16_t frameLen = AV_RB16(curPos);
        switch (frameLen)
        {
        case 960:
        case 1440:
        case 1920:
        case 2880:
        case 3840:
        case 4320:
        case 5760:
        case 7680:
        case 8640:
        case 11520:
        case 17280:
            curPos += frameLen + 4;
            break;
        default:
            return false;
        }
    }
    m_headerType = LPCMHeaderType::htM2TS;
    return true;
}